

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O0

string * __thiscall
wabt::interp::TypedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,interp *this,TypedValue *tv)

{
  Enum EVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  u32 uVar7;
  s64 sVar8;
  Ref RVar9;
  f32 fVar10;
  undefined1 local_28 [8];
  v128 simd;
  TypedValue *tv_local;
  
  simd.v._8_8_ = this;
  EVar1 = Type::operator_cast_to_Enum((Type *)this);
  switch(EVar1) {
  case Hostref:
    RVar9 = Value::Get<wabt::interp::Ref>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"hostref:%zd",RVar9.index);
    break;
  case Void:
  case Array:
  case Struct:
  case Func:
  case Any:
  case I8U:
  case I16U:
  case I32U:
    abort();
  default:
    abort();
  case Exnref:
    RVar9 = Value::Get<wabt::interp::Ref>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"exnref:%zd",RVar9.index);
    break;
  case Nullref:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"nullref");
    break;
  case Anyref:
    RVar9 = Value::Get<wabt::interp::Ref>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"anyref:%zd",RVar9.index);
    break;
  case Funcref:
    RVar9 = Value::Get<wabt::interp::Ref>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"funcref:%zd",RVar9.index);
    break;
  case I16:
    uVar7 = Value::Get<unsigned_int>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"i16:%u",(ulong)(uVar7 & 0xffff));
    break;
  case I8:
    uVar7 = Value::Get<unsigned_int>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"i8:%u",(ulong)(uVar7 & 0xff));
    break;
  case V128:
    _local_28 = Value::Get<v128>((Value *)(simd.v._8_8_ + 8));
    uVar3 = v128::u32((v128 *)local_28,0);
    uVar4 = v128::u32((v128 *)local_28,1);
    uVar5 = v128::u32((v128 *)local_28,2);
    uVar6 = v128::u32((v128 *)local_28,3);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"v128 i32x4:0x%08x 0x%08x 0x%08x 0x%08x",(ulong)uVar3,
               (ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    break;
  case F64:
    Value::Get<double>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"f64:%f");
    break;
  case F32:
    fVar10 = Value::Get<float>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"f32:%f",(double)(float)fVar10);
    break;
  case I64:
    sVar8 = Value::Get<long>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"i64:%lu",sVar8);
    break;
  case I32:
    uVar2 = Value::Get<int>((Value *)(simd.v._8_8_ + 8));
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"i32:%u",(ulong)uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypedValueToString(const TypedValue& tv) {
  switch (tv.type) {
    case Type::I32:
      return StringPrintf("i32:%u", tv.value.Get<s32>());

    case Type::I64:
      return StringPrintf("i64:%" PRIu64, tv.value.Get<s64>());

    case Type::F32:
      return StringPrintf("f32:%f", tv.value.Get<f32>());

    case Type::F64:
      return StringPrintf("f64:%f", tv.value.Get<f64>());

    case Type::V128: {
      v128 simd = tv.value.Get<v128>();
      return StringPrintf("v128 i32x4:0x%08x 0x%08x 0x%08x 0x%08x", simd.u32(0),
                          simd.u32(1), simd.u32(2), simd.u32(3));
    }

    case Type::I8:  // For SIMD lane.
      return StringPrintf("i8:%u", tv.value.Get<u32>() & 0xff);

    case Type::I16:  // For SIMD lane.
      return StringPrintf("i16:%u", tv.value.Get<u32>() & 0xffff);

    case Type::Nullref:
      return StringPrintf("nullref");

    case Type::Hostref:
      return StringPrintf("hostref:%" PRIzd, tv.value.Get<Ref>().index);

    case Type::Funcref:
      return StringPrintf("funcref:%" PRIzd, tv.value.Get<Ref>().index);

    case Type::Exnref:
      return StringPrintf("exnref:%" PRIzd, tv.value.Get<Ref>().index);

    case Type::Anyref:
      return StringPrintf("anyref:%" PRIzd, tv.value.Get<Ref>().index);

    case Type::Func:
    case Type::Struct:
    case Type::Array:
    case Type::Void:
    case Type::Any:
    case Type::I8U:
    case Type::I16U:
    case Type::I32U:
      // These types are not concrete types and should never exist as a value
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}